

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_hkdf.cc
# Opt level: O0

int pkey_hkdf_derive(EVP_PKEY_CTX *ctx,uint8_t *out,size_t *out_len)

{
  int *piVar1;
  ulong uVar2;
  size_t sVar3;
  EVP_MD *pEVar4;
  uint8_t *puVar5;
  size_t sVar6;
  int iVar7;
  undefined4 extraout_var;
  uint8_t *info;
  size_t info_len;
  undefined4 extraout_var_00;
  uint8_t *puVar8;
  size_t sVar9;
  HKDF_PKEY_CTX *hctx;
  size_t *out_len_local;
  uint8_t *out_local;
  EVP_PKEY_CTX *ctx_local;
  
  piVar1 = (int *)ctx->data;
  if (*(long *)(piVar1 + 2) == 0) {
    ERR_put_error(6,0,0x76,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_hkdf.cc"
                  ,0x68);
    ctx_local._4_4_ = 0;
  }
  else if (*(long *)(piVar1 + 6) == 0) {
    ERR_put_error(6,0,0x78,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_hkdf.cc"
                  ,0x6c);
    ctx_local._4_4_ = 0;
  }
  else if (out == (uint8_t *)0x0) {
    if (*piVar1 == 1) {
      iVar7 = EVP_MD_size(*(EVP_MD **)(piVar1 + 2));
      *out_len = CONCAT44(extraout_var,iVar7);
    }
    ctx_local._4_4_ = 1;
  }
  else {
    iVar7 = *piVar1;
    if (iVar7 == 0) {
      sVar3 = *out_len;
      pEVar4 = *(EVP_MD **)(piVar1 + 2);
      puVar5 = *(uint8_t **)(piVar1 + 4);
      sVar6 = *(size_t *)(piVar1 + 6);
      puVar8 = *(uint8_t **)(piVar1 + 8);
      sVar9 = *(size_t *)(piVar1 + 10);
      info = CBB_data((CBB *)(piVar1 + 0xc));
      info_len = CBB_len((CBB *)(piVar1 + 0xc));
      ctx_local._4_4_ = HKDF(out,sVar3,pEVar4,puVar5,sVar6,puVar8,sVar9,info,info_len);
    }
    else if (iVar7 == 1) {
      uVar2 = *out_len;
      iVar7 = EVP_MD_size(*(EVP_MD **)(piVar1 + 2));
      if (uVar2 < CONCAT44(extraout_var_00,iVar7)) {
        ERR_put_error(6,0,100,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_hkdf.cc"
                      ,0x80);
        ctx_local._4_4_ = 0;
      }
      else {
        ctx_local._4_4_ =
             HKDF_extract(out,out_len,*(EVP_MD **)(piVar1 + 2),*(uint8_t **)(piVar1 + 4),
                          *(size_t *)(piVar1 + 6),*(uint8_t **)(piVar1 + 8),*(size_t *)(piVar1 + 10)
                         );
      }
    }
    else if (iVar7 == 2) {
      sVar3 = *out_len;
      pEVar4 = *(EVP_MD **)(piVar1 + 2);
      puVar5 = *(uint8_t **)(piVar1 + 4);
      sVar6 = *(size_t *)(piVar1 + 6);
      puVar8 = CBB_data((CBB *)(piVar1 + 0xc));
      sVar9 = CBB_len((CBB *)(piVar1 + 0xc));
      ctx_local._4_4_ = HKDF_expand(out,sVar3,pEVar4,puVar5,sVar6,puVar8,sVar9);
    }
    else {
      ERR_put_error(6,0,0x44,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_hkdf.cc"
                    ,0x8a);
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int pkey_hkdf_derive(EVP_PKEY_CTX *ctx, uint8_t *out, size_t *out_len) {
  HKDF_PKEY_CTX *hctx = reinterpret_cast<HKDF_PKEY_CTX *>(ctx->data);
  if (hctx->md == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_MISSING_PARAMETERS);
    return 0;
  }
  if (hctx->key_len == 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_NO_KEY_SET);
    return 0;
  }

  if (out == NULL) {
    if (hctx->mode == EVP_PKEY_HKDEF_MODE_EXTRACT_ONLY) {
      *out_len = EVP_MD_size(hctx->md);
    }
    // HKDF-Expand is variable-length and returns |*out_len| bytes. "Output" the
    // input length by leaving it alone.
    return 1;
  }

  switch (hctx->mode) {
    case EVP_PKEY_HKDEF_MODE_EXTRACT_AND_EXPAND:
      return HKDF(out, *out_len, hctx->md, hctx->key, hctx->key_len, hctx->salt,
                  hctx->salt_len, CBB_data(&hctx->info), CBB_len(&hctx->info));

    case EVP_PKEY_HKDEF_MODE_EXTRACT_ONLY:
      if (*out_len < EVP_MD_size(hctx->md)) {
        OPENSSL_PUT_ERROR(EVP, EVP_R_BUFFER_TOO_SMALL);
        return 0;
      }
      return HKDF_extract(out, out_len, hctx->md, hctx->key, hctx->key_len,
                          hctx->salt, hctx->salt_len);

    case EVP_PKEY_HKDEF_MODE_EXPAND_ONLY:
      return HKDF_expand(out, *out_len, hctx->md, hctx->key, hctx->key_len,
                         CBB_data(&hctx->info), CBB_len(&hctx->info));
  }
  OPENSSL_PUT_ERROR(EVP, ERR_R_INTERNAL_ERROR);
  return 0;
}